

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O1

void glmc_rotate(vec4 *m,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  fVar6 = cosf(angle);
  fVar7 = axis[2] * axis[2] + *axis * *axis + axis[1] * axis[1];
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar12 = 0.0;
  if (fVar7 < 1.1920929e-07) {
    fVar10 = 0.0;
    fVar7 = 0.0;
  }
  else {
    fVar7 = 1.0 / fVar7;
    fVar12 = *axis * fVar7;
    fVar10 = fVar7 * (float)*(undefined8 *)(axis + 1);
    fVar7 = fVar7 * (float)((ulong)*(undefined8 *)(axis + 1) >> 0x20);
  }
  fVar8 = 1.0 - fVar6;
  fVar14 = fVar8 * fVar12;
  fVar15 = fVar8 * fVar10;
  fVar8 = fVar8 * fVar7;
  fVar9 = sinf(angle);
  fVar16 = fVar12 * fVar14 + fVar6;
  fVar17 = fVar12 * fVar15 - fVar9 * fVar7;
  fVar20 = fVar12 * fVar8 + fVar10 * fVar9;
  fVar11 = fVar10 * fVar14 + fVar9 * fVar7;
  fVar13 = fVar10 * fVar15 + fVar6;
  fVar21 = fVar10 * fVar8 - fVar12 * fVar9;
  fVar18 = fVar14 * fVar7 - fVar10 * fVar9;
  fVar19 = fVar15 * fVar7 + fVar12 * fVar9;
  fVar6 = fVar8 * fVar7 + fVar6;
  fVar7 = (*m)[0];
  fVar12 = (*m)[1];
  fVar10 = (*m)[2];
  fVar8 = (*m)[3];
  fVar9 = m[1][0];
  fVar14 = m[1][1];
  fVar15 = m[1][2];
  fVar1 = m[1][3];
  fVar2 = m[2][0];
  fVar3 = m[2][1];
  fVar4 = m[2][2];
  fVar5 = m[2][3];
  (*m)[0] = fVar18 * fVar2 + fVar11 * fVar9 + fVar16 * fVar7;
  (*m)[1] = fVar18 * fVar3 + fVar11 * fVar14 + fVar16 * fVar12;
  (*m)[2] = fVar18 * fVar4 + fVar11 * fVar15 + fVar16 * fVar10;
  (*m)[3] = fVar18 * fVar5 + fVar11 * fVar1 + fVar16 * fVar8;
  m[1][0] = fVar19 * fVar2 + fVar13 * fVar9 + fVar17 * fVar7;
  m[1][1] = fVar19 * fVar3 + fVar13 * fVar14 + fVar17 * fVar12;
  m[1][2] = fVar19 * fVar4 + fVar13 * fVar15 + fVar17 * fVar10;
  m[1][3] = fVar19 * fVar5 + fVar13 * fVar1 + fVar17 * fVar8;
  m[2][0] = fVar6 * fVar2 + fVar21 * fVar9 + fVar20 * fVar7;
  m[2][1] = fVar6 * fVar3 + fVar21 * fVar14 + fVar20 * fVar12;
  m[2][2] = fVar6 * fVar4 + fVar21 * fVar15 + fVar20 * fVar10;
  m[2][3] = fVar6 * fVar5 + fVar21 * fVar1 + fVar20 * fVar8;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate(mat4 m, float angle, vec3 axis) {
  glm_rotate(m, angle, axis);
}